

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O1

void plutovg_matrix_multiply
               (plutovg_matrix_t *matrix,plutovg_matrix_t *left,plutovg_matrix_t *right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = left->a;
  fVar2 = left->b;
  fVar3 = right->c;
  fVar4 = right->a;
  fVar5 = right->b;
  fVar6 = right->d;
  fVar7 = left->c;
  fVar8 = left->d;
  fVar9 = left->e;
  fVar10 = left->f;
  fVar11 = right->e;
  fVar12 = right->f;
  matrix->a = fVar1 * fVar4 + fVar2 * fVar3;
  matrix->b = fVar1 * fVar5 + fVar2 * fVar6;
  matrix->c = fVar7 * fVar4 + fVar3 * fVar8;
  matrix->d = fVar7 * fVar5 + fVar8 * fVar6;
  matrix->e = fVar4 * fVar9 + fVar3 * fVar10 + fVar11;
  matrix->f = fVar9 * fVar5 + fVar6 * fVar10 + fVar12;
  return;
}

Assistant:

void plutovg_matrix_multiply(plutovg_matrix_t* matrix, const plutovg_matrix_t* left, const plutovg_matrix_t* right)
{
    float a = left->a * right->a + left->b * right->c;
    float b = left->a * right->b + left->b * right->d;
    float c = left->c * right->a + left->d * right->c;
    float d = left->c * right->b + left->d * right->d;
    float e = left->e * right->a + left->f * right->c + right->e;
    float f = left->e * right->b + left->f * right->d + right->f;
    plutovg_matrix_init(matrix, a, b, c, d, e, f);
}